

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,int port,XMLCh *userinfo,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh theChar;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  
  bVar3 = isWellFormedAddress(host,manager);
  bVar5 = false;
  if (((port + 1U < 0x10001) && (bVar5 = false, bVar3)) && (bVar5 = true, userinfo != (XMLCh *)0x0))
  {
    theChar = *userinfo;
    while (theChar != L'\0') {
      bVar3 = XMLString::isAlphaNum(theChar);
      lVar6 = 2;
      if (((!bVar3) && (iVar4 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar4 == -1))
         && (iVar4 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*userinfo), iVar4 == -1)) {
        if (*userinfo != L'%') {
          return false;
        }
        lVar6 = 2;
        do {
          psVar1 = (short *)((long)userinfo + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 != 0);
        if (0xfffffffffffffffc < (lVar6 >> 1) - 4U) {
          return false;
        }
        bVar3 = XMLString::isHex(userinfo[1]);
        if (!bVar3) {
          return false;
        }
        bVar3 = XMLString::isHex(userinfo[2]);
        lVar6 = 6;
        if (!bVar3) {
          return false;
        }
      }
      pXVar2 = (XMLCh *)((long)userinfo + lVar6);
      userinfo = (XMLCh *)((long)userinfo + lVar6);
      theChar = *pXVar2;
    }
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host
                                         , const int port
                                         , const XMLCh* const userinfo
                                         , MemoryManager* const manager)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, manager))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    if (!userinfo)
        return true;

    const XMLCh* tmpStr = userinfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}